

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void setJoinExpr(Expr *p,int iTable)

{
  ExprList *pEVar1;
  long lVar2;
  long lVar3;
  
  if (p != (Expr *)0x0) {
    do {
      *(byte *)&p->flags = (byte)p->flags | 1;
      p->iRightJoinTable = (i16)iTable;
      if (((p->op == 0x9d) && ((p->x).pList != (ExprList *)0x0)) &&
         (pEVar1 = (p->x).pList, 0 < pEVar1->nExpr)) {
        lVar3 = 8;
        lVar2 = 0;
        do {
          setJoinExpr(*(Expr **)((long)pEVar1->a + lVar3 + -8),iTable);
          lVar2 = lVar2 + 1;
          pEVar1 = (p->x).pList;
          lVar3 = lVar3 + 0x20;
        } while (lVar2 < pEVar1->nExpr);
      }
      setJoinExpr(p->pLeft,iTable);
      p = p->pRight;
    } while (p != (Expr *)0x0);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->iRightJoinTable = (i16)iTable;
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        setJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}